

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ReadSchema(Parse *pParse)

{
  sqlite3 *db_00;
  sqlite3 *db;
  int rc;
  Parse *pParse_local;
  
  db._4_4_ = 0;
  db_00 = pParse->db;
  if ((db_00->init).busy == '\0') {
    db._4_4_ = sqlite3Init(db_00,&pParse->zErrMsg);
    if (db._4_4_ == 0) {
      if (db_00->noSharedCache != '\0') {
        db_00->mDbFlags = db_00->mDbFlags | 0x10;
      }
    }
    else {
      pParse->rc = db._4_4_;
      pParse->nErr = pParse->nErr + 1;
    }
  }
  return db._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ReadSchema(Parse *pParse){
  int rc = SQLITE_OK;
  sqlite3 *db = pParse->db;
  assert( sqlite3_mutex_held(db->mutex) );
  if( !db->init.busy ){
    rc = sqlite3Init(db, &pParse->zErrMsg);
    if( rc!=SQLITE_OK ){
      pParse->rc = rc;
      pParse->nErr++;
    }else if( db->noSharedCache ){
      db->mDbFlags |= DBFLAG_SchemaKnownOk;
    }
  }
  return rc;
}